

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

bool __thiscall
Lib::DHMap<Kernel::Literal_*,_unsigned_long,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
          (DHMap<Kernel::Literal_*,_unsigned_long,_Lib::DefaultHash,_Lib::DefaultHash2> *this,
          Literal *key,unsigned_long val)

{
  uint uVar1;
  Entry *pEVar2;
  uint uVar3;
  uint uVar4;
  Literal *local_18;
  
  local_18 = key;
  if (this->_nextExpansionOccupancy <= this->_deleted + this->_size) {
    expand(this);
  }
  pEVar2 = findEntryToInsert(this,&local_18);
  uVar4 = (uint)(pEVar2->field_0)._infoData >> 2;
  uVar1 = this->_timestamp;
  uVar3 = (pEVar2->field_0)._infoData & 1;
  if (uVar4 != uVar1 || uVar3 != 0) {
    if (uVar4 == uVar1) {
      this->_deleted = this->_deleted + -1;
    }
    else {
      (pEVar2->field_0)._infoData = uVar3 + uVar1 * 4;
    }
    *(byte *)&pEVar2->field_0 = *(byte *)&pEVar2->field_0 & 0xfe;
    pEVar2->_key = local_18;
    pEVar2->_val = val;
    this->_size = this->_size + 1;
  }
  return uVar4 != uVar1 || uVar3 != 0;
}

Assistant:

bool insert(Key key, Val val)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key = std::move(key);
      e->_val = std::move(val);
      _size++;
    }
    return !exists;

  }